

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O3

void init_iopage(void)

{
  IOPAGE *pIVar1;
  
  pIVar1 = IOPage;
  IOPage->dlutilin = 0xffff;
  pIVar1->dlkbdad1 = 0xffff;
  pIVar1->dlkbdad0 = 0xffff;
  pIVar1->dlkbdad3 = 0xffff;
  pIVar1->dlkbdad2 = 0xffff;
  pIVar1->dlkbdad5 = 0xffff;
  pIVar1->dlkbdad4 = 0xffff;
  return;
}

Assistant:

void init_iopage(void) {
  /*
   * Initialize IOPAGE
   */
  IOPage->dlkbdad0 = 65535; /* ALL UP */
  IOPage->dlkbdad1 = 65535; /* ALL UP */
  IOPage->dlkbdad2 = 65535; /* ALL UP */
  IOPage->dlkbdad3 = 65535; /* ALL UP */
  IOPage->dlkbdad4 = 65535; /* ALL UP */
  IOPage->dlkbdad5 = 65535; /* ALL UP */
  IOPage->dlutilin = 65535; /* ALL UP */
}